

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OS_linux_common.cpp
# Opt level: O2

bool __thiscall
OS::Services_Common::GetControl(Services_Common *this,string *name,void *pValue,size_t size)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  uint *puVal;
  string *psVar6;
  string fileName;
  allocator local_49;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,ENV_PREFIX,&local_49);
  std::__cxx11::string::append((string *)&local_48);
  pcVar4 = getenv(local_48._M_dataplus._M_p);
  if (size == 4 && pcVar4 != (char *)0x0) {
    iVar3 = atoi(pcVar4);
    *(int *)pValue = iVar3;
LAB_001069fe:
    std::__cxx11::string::~string((string *)&local_48);
    return true;
  }
  if ((pcVar4 != (char *)0x0) && (sVar5 = strlen(pcVar4), sVar5 < size)) {
    strcpy((char *)pValue,pcVar4);
    goto LAB_001069fe;
  }
  std::__cxx11::string::~string((string *)&local_48);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  pcVar4 = getenv("HOME");
  if (pcVar4 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&local_48);
    std::__cxx11::string::append((char *)&local_48);
    psVar6 = &local_48;
    std::__cxx11::string::append((char *)psVar6);
    bVar1 = GetControlFromFile((Services_Common *)psVar6,&local_48,name,pValue,size);
    bVar2 = true;
    if (bVar1) goto LAB_00106ad6;
  }
  std::__cxx11::string::assign((char *)&local_48);
  std::__cxx11::string::append((char *)&local_48);
  psVar6 = &local_48;
  std::__cxx11::string::append((char *)psVar6);
  bVar2 = GetControlFromFile((Services_Common *)psVar6,&local_48,name,pValue,size);
LAB_00106ad6:
  std::__cxx11::string::~string((string *)&local_48);
  return bVar2;
}

Assistant:

bool Services_Common::GetControl(
    const std::string& name,
    void* pValue,
    size_t size ) const
{
    // Look at environment variables first:
    {
        std::string envName(ENV_PREFIX);
        envName += name;
        const char *envVal = getenv(envName.c_str());
        if( ( envVal != NULL ) && ( size == sizeof(unsigned int) ) )
        {
            unsigned int *puVal = (unsigned int *)pValue;
            *puVal = atoi(envVal);
            return true;
        }
        else if( ( envVal != NULL ) && ( strlen(envVal) < size ) )
        {
            char* pStr = (char*)pValue;
            strcpy( pStr, envVal );
            return true;
        }
    }

    // Look at config files second:
    bool    found = false;
    std::string fileName;

    // First, check for a config file in the HOME directory.
    const char *envVal = getenv("HOME");
    if( !found && envVal != NULL )
    {
        fileName = envVal;
        fileName += "/";
        fileName += CONFIG_FILE;
        found = GetControlFromFile(
            fileName,
            name,
            pValue,
            size );
    }

#ifdef __ANDROID__
    // On Android, check the sdcard directory next.
    if( !found )
    {
        fileName = "/sdcard/";
        fileName += CONFIG_FILE;
        found = GetControlFromFile(
            fileName,
            name,
            pValue,
            size );
    }
#endif

    // Finally, check the "system" directory.
    if( !found )
    {
        fileName = SYSTEM_DIR;
        fileName += "/";
        fileName += CONFIG_FILE;
        found = GetControlFromFile(
            fileName,
            name,
            pValue,
            size );
    }

    return found;
}